

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int cuddSwapInPlace(DdManager *table,int x,int y)

{
  int *piVar1;
  DdHalfWord *pDVar2;
  DdHalfWord x_00;
  int iVar3;
  DdHalfWord y_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  DdHalfWord DVar7;
  DdHalfWord DVar8;
  Cudd_LazyGroupType CVar9;
  DdSubtable *pDVar10;
  DdNode **ppDVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  DdNode *pDVar15;
  DdSubtable *pDVar16;
  DdSubtable *pDVar17;
  Cudd_VariableType CVar18;
  Cudd_VariableType CVar19;
  _func_void_long *p_Var20;
  int iVar21;
  ulong uVar22;
  DdNode **ppDVar23;
  DdNode *pDVar24;
  DdNode *pDVar25;
  DdNode *pDVar26;
  DdNode *pDVar27;
  ulong uVar28;
  uint uVar29;
  DdManager *pDVar30;
  DdNode *pDVar31;
  DdNode **ppDVar32;
  ulong uVar33;
  DdNode *pDVar34;
  DdNode **ppDVar35;
  uint uVar36;
  DdManager *pDVar37;
  DdManager *pDVar38;
  DdNode *pDVar39;
  DdManager *pDVar40;
  uint uVar41;
  uint uVar42;
  DdNode *pDVar43;
  uint uVar44;
  int local_cc;
  DdNode **local_c8;
  uint local_b0;
  
  ddTotalNumberSwapping = ddTotalNumberSwapping + 1;
  pDVar10 = table->subtables;
  x_00 = table->invperm[x];
  local_c8 = pDVar10[x].nodelist;
  uVar42 = pDVar10[x].keys;
  local_b0 = pDVar10[x].slots;
  uVar28 = (ulong)local_b0;
  iVar3 = pDVar10[x].shift;
  y_00 = table->invperm[y];
  ppDVar11 = pDVar10[y].nodelist;
  uVar4 = pDVar10[y].keys;
  uVar5 = pDVar10[y].slots;
  iVar6 = pDVar10[y].shift;
  iVar21 = cuddTestInteract(table,x_00,y_00);
  uVar36 = uVar42;
  uVar41 = uVar4;
  local_cc = iVar3;
  if (iVar21 == 0) goto LAB_0066ac95;
  DVar7 = table->vars[(int)x_00]->ref;
  DVar8 = table->vars[(int)y_00]->ref;
  if ((int)uVar42 < (int)local_b0) {
    if (uVar42 != local_b0 * 4 && SBORROW4(uVar42,local_b0 * 4) == (int)(uVar42 + local_b0 * -4) < 0
        || local_b0 != table->initSlots) goto LAB_0066a659;
LAB_0066a5bf:
    uVar22 = 0;
    uVar33 = 0;
    if (0 < (int)local_b0) {
      uVar33 = uVar28;
    }
    uVar36 = 0;
    pDVar40 = (DdManager *)0x0;
    for (; ppDVar23 = local_c8, uVar22 != uVar33; uVar22 = uVar22 + 1) {
      ppDVar23 = local_c8 + uVar22;
      pDVar37 = (DdManager *)*ppDVar23;
      while (pDVar38 = pDVar37, pDVar38 != table) {
        pDVar37 = (DdManager *)(pDVar38->sentinel).next;
        if ((((pDVar38->sentinel).type.kids.T)->index == y_00) ||
           (*(DdHalfWord *)((ulong)(pDVar38->sentinel).type.kids.E & 0xfffffffffffffffe) == y_00)) {
          (pDVar38->sentinel).index = y_00;
          (pDVar38->sentinel).next = &pDVar40->sentinel;
          pDVar40 = pDVar38;
        }
        else {
          uVar36 = uVar36 + 1;
          *ppDVar23 = &pDVar38->sentinel;
          ppDVar23 = &(pDVar38->sentinel).next;
        }
      }
      *ppDVar23 = &table->sentinel;
    }
  }
  else {
    if (uVar42 == local_b0 * 4 || SBORROW4(uVar42,local_b0 * 4) != (int)(uVar42 + local_b0 * -4) < 0
       ) goto LAB_0066a5bf;
LAB_0066a659:
    uVar22 = 0;
    uVar33 = 0;
    if (0 < (int)local_b0) {
      uVar33 = uVar28;
    }
    uVar36 = 0;
    pDVar40 = (DdManager *)0x0;
    pDVar37 = (DdManager *)0x0;
    for (; p_Var20 = Extra_UtilMMoutOfMemory, uVar22 != uVar33; uVar22 = uVar22 + 1) {
      pDVar38 = (DdManager *)local_c8[uVar22];
      while (pDVar30 = pDVar38, pDVar30 != table) {
        pDVar38 = (DdManager *)(pDVar30->sentinel).next;
        if ((((pDVar30->sentinel).type.kids.T)->index == y_00) ||
           (*(DdHalfWord *)((ulong)(pDVar30->sentinel).type.kids.E & 0xfffffffffffffffe) == y_00)) {
          (pDVar30->sentinel).index = y_00;
          (pDVar30->sentinel).next = &pDVar40->sentinel;
          pDVar40 = pDVar30;
        }
        else {
          (pDVar30->sentinel).next = &pDVar37->sentinel;
          uVar36 = uVar36 + 1;
          pDVar37 = pDVar30;
        }
      }
    }
    for (; (uint)((int)uVar28 * 4) < uVar42; uVar28 = (ulong)(uint)((int)uVar28 * 2)) {
      local_cc = local_cc + -1;
    }
    while ((uVar44 = (uint)uVar28, uVar42 < uVar44 && (table->initSlots < uVar44))) {
      local_cc = local_cc + 1;
      uVar28 = (ulong)(uVar44 >> 1);
    }
    ppDVar23 = (DdNode **)malloc(uVar28 << 3);
    Extra_UtilMMoutOfMemory = p_Var20;
    if (ppDVar23 == (DdNode **)0x0) {
      fprintf((FILE *)table->err,"Unable to resize subtable %d for lack of memory\n",uVar33);
      ppDVar23 = local_c8;
      local_cc = iVar3;
    }
    else {
      uVar29 = table->slots + (uVar44 - local_b0);
      table->slots = uVar29;
      table->minDead = (uint)(long)((double)uVar29 * table->gcFrac);
      uVar12 = uVar29 * 4;
      if (table->maxCacheHard <= uVar29 * 4) {
        uVar12 = table->maxCacheHard;
      }
      table->cacheSlack = uVar12 + table->cacheSlots * -2;
      table->memused = table->memused + (long)(int)(uVar44 - local_b0) * 8;
      free(local_c8);
      uVar33 = 0;
      local_b0 = uVar44;
      if (0 < (int)uVar44) {
        uVar33 = uVar28;
      }
    }
    for (uVar28 = 0; uVar33 != uVar28; uVar28 = uVar28 + 1) {
      ppDVar23[uVar28] = &table->sentinel;
    }
    while (pDVar37 != (DdManager *)0x0) {
      pDVar27 = (pDVar37->sentinel).type.kids.T;
      pDVar34 = (pDVar37->sentinel).type.kids.E;
      pDVar38 = (DdManager *)(pDVar37->sentinel).next;
      ppDVar35 = ppDVar23 +
                 (int)((((uint)pDVar34 & 1) +
                        *(int *)(((ulong)pDVar34 & 0xfffffffffffffffe) + 0x20) * 2 +
                       (((uint)pDVar27 & 1) +
                       *(int *)(((ulong)pDVar27 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                       0x40f1f9 >> ((byte)local_cc & 0x1f));
      do {
        ppDVar32 = ppDVar35;
        pDVar39 = *ppDVar32;
        pDVar24 = (pDVar39->type).kids.T;
        ppDVar35 = &pDVar39->next;
      } while (pDVar27 < pDVar24);
      while ((pDVar27 == pDVar24 && (pDVar34 < (pDVar39->type).kids.E))) {
        ppDVar32 = &pDVar39->next;
        pDVar24 = (pDVar39->next->type).kids.T;
        pDVar39 = pDVar39->next;
      }
      (pDVar37->sentinel).next = pDVar39;
      *ppDVar32 = &pDVar37->sentinel;
      pDVar37 = pDVar38;
    }
  }
  while (pDVar40 != (DdManager *)0x0) {
    pDVar27 = (pDVar40->sentinel).type.kids.T;
    pDVar34 = pDVar27;
    pDVar39 = pDVar27;
    if (pDVar27->index == y_00) {
      pDVar34 = (pDVar27->type).kids.T;
      pDVar39 = (pDVar27->type).kids.E;
    }
    pDVar24 = (pDVar40->sentinel).type.kids.E;
    pDVar43 = (DdNode *)((ulong)pDVar24 & 0xfffffffffffffffe);
    pDVar25 = pDVar43;
    pDVar31 = pDVar43;
    if (pDVar43->index == y_00) {
      pDVar25 = (pDVar43->type).kids.T;
      pDVar31 = *(DdNode **)((long)&pDVar43->type + 8);
    }
    pDVar37 = (DdManager *)(pDVar40->sentinel).next;
    pDVar26 = (DdNode *)((ulong)pDVar31 ^ 1);
    pDVar15 = (DdNode *)((ulong)pDVar25 ^ 1);
    if (((ulong)pDVar24 & 1) == 0) {
      pDVar26 = pDVar31;
      pDVar15 = pDVar25;
    }
    pDVar27->ref = pDVar27->ref - 1;
    pDVar27 = pDVar34;
    pDVar24 = pDVar34;
    if (pDVar34 != pDVar15) {
      ppDVar35 = ppDVar23 +
                 (int)((((uint)pDVar15 & 1) +
                        (int)((DdNode *)((ulong)pDVar15 & 0xfffffffffffffffe))->Id * 2 +
                       (((uint)pDVar34 & 1) +
                       *(int *)(((ulong)pDVar34 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                       0x40f1f9 >> ((byte)local_cc & 0x1f));
      do {
        ppDVar32 = ppDVar35;
        pDVar27 = *ppDVar32;
        pDVar24 = (pDVar27->type).kids.T;
        ppDVar35 = &pDVar27->next;
      } while (pDVar34 < pDVar24);
      while (pDVar34 == pDVar24) {
        pDVar25 = (pDVar27->type).kids.E;
        if (pDVar25 <= pDVar15) {
          pDVar24 = pDVar27;
          if (pDVar15 == pDVar25) goto LAB_0066a9f4;
          break;
        }
        ppDVar32 = &pDVar27->next;
        pDVar24 = (pDVar27->next->type).kids.T;
        pDVar27 = pDVar27->next;
      }
      pDVar24 = cuddDynamicAllocNode(table);
      if (pDVar24 == (DdNode *)0x0) goto LAB_0066ad66;
      pDVar24->index = x_00;
      pDVar24->ref = 1;
      (pDVar24->type).kids.T = pDVar34;
      (pDVar24->type).kids.E = pDVar15;
      uVar36 = uVar36 + 1;
      pDVar24->next = *ppDVar32;
      *ppDVar32 = pDVar24;
      pDVar34->ref = pDVar34->ref + 1;
      pDVar27 = (DdNode *)((ulong)pDVar15 & 0xfffffffffffffffe);
    }
LAB_0066a9f4:
    pDVar27->ref = pDVar27->ref + 1;
    (pDVar40->sentinel).type.kids.T = pDVar24;
    pDVar43->ref = pDVar43->ref - 1;
    if (pDVar39 == pDVar26) {
      piVar1 = (int *)(((ulong)pDVar39 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
    }
    else {
      pDVar34 = (DdNode *)((ulong)pDVar39 & 0xfffffffffffffffe);
      pDVar27 = (DdNode *)((ulong)pDVar26 ^ 1);
      if (((ulong)pDVar39 & 1) == 0) {
        pDVar34 = pDVar39;
        pDVar27 = pDVar26;
      }
      ppDVar35 = ppDVar23 +
                 (int)((((uint)pDVar27 & 1) +
                        (int)((DdNode *)((ulong)pDVar27 & 0xfffffffffffffffe))->Id * 2 +
                       (((uint)pDVar34 & 1) +
                       *(int *)(((ulong)pDVar34 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                       0x40f1f9 >> ((byte)local_cc & 0x1f));
      do {
        ppDVar32 = ppDVar35;
        pDVar25 = *ppDVar32;
        pDVar31 = (pDVar25->type).kids.T;
        ppDVar35 = &pDVar25->next;
      } while (pDVar34 < pDVar31);
      while (pDVar34 == pDVar31) {
        pDVar31 = (pDVar25->type).kids.E;
        if (pDVar31 <= pDVar27) {
          pDVar26 = pDVar25;
          if (pDVar27 == pDVar31) goto LAB_0066ab00;
          break;
        }
        ppDVar32 = &pDVar25->next;
        pDVar31 = (pDVar25->next->type).kids.T;
        pDVar25 = pDVar25->next;
      }
      pDVar26 = cuddDynamicAllocNode(table);
      if (pDVar26 == (DdNode *)0x0) {
LAB_0066ad66:
        fwrite("Error: cuddSwapInPlace out of memory\n",0x25,1,(FILE *)table->err);
        return 0;
      }
      pDVar26->index = x_00;
      pDVar26->ref = 1;
      (pDVar26->type).kids.T = pDVar34;
      (pDVar26->type).kids.E = pDVar27;
      uVar36 = uVar36 + 1;
      pDVar26->next = *ppDVar32;
      *ppDVar32 = pDVar26;
      pDVar34->ref = pDVar34->ref + 1;
      pDVar25 = (DdNode *)((ulong)pDVar27 & 0xfffffffffffffffe);
LAB_0066ab00:
      pDVar25->ref = pDVar25->ref + 1;
      if (((ulong)pDVar39 & 1) != 0) {
        pDVar26 = (DdNode *)((ulong)pDVar26 ^ 1);
      }
    }
    (pDVar40->sentinel).type.kids.E = pDVar26;
    ppDVar35 = ppDVar11 +
               (int)((((uint)pDVar26 & 1) +
                      *(int *)(((ulong)pDVar26 & 0xfffffffffffffffe) + 0x20) * 2 +
                     (((uint)pDVar24 & 1) +
                     *(int *)(((ulong)pDVar24 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                     0x40f1f9 >> ((byte)iVar6 & 0x1f));
    do {
      ppDVar32 = ppDVar35;
      pDVar27 = *ppDVar32;
      pDVar34 = (pDVar27->type).kids.T;
      ppDVar35 = &pDVar27->next;
    } while (pDVar24 < pDVar34);
    uVar41 = uVar41 + 1;
    while ((pDVar24 == pDVar34 && (pDVar26 < (pDVar27->type).kids.E))) {
      ppDVar32 = &pDVar27->next;
      pDVar34 = (pDVar27->next->type).kids.T;
      pDVar27 = pDVar27->next;
    }
    (pDVar40->sentinel).next = pDVar27;
    *ppDVar32 = &pDVar40->sentinel;
    pDVar40 = pDVar37;
  }
  uVar28 = 0;
  uVar33 = 0;
  if (0 < (int)uVar5) {
    uVar33 = (ulong)uVar5;
  }
  for (; uVar28 != uVar33; uVar28 = uVar28 + 1) {
    ppDVar35 = ppDVar11 + uVar28;
    pDVar40 = (DdManager *)*ppDVar35;
    while (pDVar40 != table) {
      pDVar37 = (DdManager *)(pDVar40->sentinel).next;
      if ((pDVar40->sentinel).ref == 0) {
        pDVar2 = &((pDVar40->sentinel).type.kids.T)->ref;
        *pDVar2 = *pDVar2 - 1;
        piVar1 = (int *)(((ulong)(pDVar40->sentinel).type.kids.E & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        (pDVar40->sentinel).next = table->nextFree;
        table->nextFree = &pDVar40->sentinel;
        uVar41 = uVar41 - 1;
        pDVar40 = pDVar37;
      }
      else {
        *ppDVar35 = &pDVar40->sentinel;
        ppDVar35 = &(pDVar40->sentinel).next;
        pDVar40 = pDVar37;
      }
    }
    *ppDVar35 = &table->sentinel;
  }
  table->isolated =
       (-(uint)(DVar8 == 1) - (uint)(DVar7 == 1)) + (uint)(table->vars[(int)x_00]->ref == 1) +
       table->isolated + (uint)(table->vars[(int)y_00]->ref == 1);
  local_c8 = ppDVar23;
LAB_0066ac95:
  pDVar10 = table->subtables;
  pDVar10[x].nodelist = ppDVar11;
  pDVar10[x].slots = uVar5;
  pDVar10[x].shift = iVar6;
  pDVar10[x].keys = uVar41;
  pDVar10[x].maxKeys = uVar5 << 2;
  pDVar16 = pDVar10 + x;
  iVar3 = pDVar16->bindVar;
  CVar19 = pDVar16->varType;
  uVar13 = *(undefined8 *)(&pDVar16->bindVar + 2);
  pDVar16 = pDVar10 + y;
  CVar18 = pDVar16->varType;
  uVar14 = *(undefined8 *)(&pDVar16->bindVar + 2);
  pDVar17 = pDVar10 + x;
  pDVar17->bindVar = pDVar16->bindVar;
  pDVar17->varType = CVar18;
  *(undefined8 *)(&pDVar17->bindVar + 2) = uVar14;
  pDVar16 = pDVar10 + y;
  pDVar16->bindVar = iVar3;
  pDVar16->varType = CVar19;
  *(undefined8 *)(&pDVar16->bindVar + 2) = uVar13;
  CVar9 = pDVar10[x].varToBeGrouped;
  pDVar10[x].varToBeGrouped = pDVar10[y].varToBeGrouped;
  pDVar10[y].varToBeGrouped = CVar9;
  pDVar10[y].nodelist = local_c8;
  pDVar10[y].slots = local_b0;
  pDVar10[y].shift = local_cc;
  pDVar10[y].keys = uVar36;
  pDVar10[y].maxKeys = local_b0 << 2;
  piVar1 = table->perm;
  piVar1[(int)x_00] = y;
  piVar1[(int)y_00] = x;
  piVar1 = table->invperm;
  piVar1[x] = y_00;
  piVar1[y] = x_00;
  uVar42 = (uVar41 - (uVar4 + uVar42)) + uVar36 + table->keys;
  table->keys = uVar42;
  return uVar42 - table->isolated;
}

Assistant:

int
cuddSwapInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int    xindex, yindex;
    int    xslots, yslots;
    int    xshift, yshift;
    int    oldxkeys, oldykeys;
    int    newxkeys, newykeys;
    int    comple, newcomplement;
    int    i;
    Cudd_VariableType varType;
    Cudd_LazyGroupType groupType;
    int    posn;
    int    isolated;
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10,*newf1,*newf0;
    DdNode *g,*next;
    DdNodePtr *previousP;
    DdNode *tmp;
    DdNode *sentinel = &(table->sentinel);
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

#ifdef DD_DEBUG
    int    count,idcheck;
#endif

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddNextHigh(table,x) == y);
    assert(table->subtables[x].keys != 0);
    assert(table->subtables[y].keys != 0);
    assert(table->subtables[x].dead == 0);
    assert(table->subtables[y].dead == 0);
#endif

    ddTotalNumberSwapping++;

    /* Get parameters of x subtable. */
    xindex = table->invperm[x];
    xlist = table->subtables[x].nodelist;
    oldxkeys = table->subtables[x].keys;
    xslots = table->subtables[x].slots;
    xshift = table->subtables[x].shift;

    /* Get parameters of y subtable. */
    yindex = table->invperm[y];
    ylist = table->subtables[y].nodelist;
    oldykeys = table->subtables[y].keys;
    yslots = table->subtables[y].slots;
    yshift = table->subtables[y].shift;

    if (!cuddTestInteract(table,xindex,yindex)) {
#ifdef DD_STATS
        ddTotalNISwaps++;
#endif
        newxkeys = oldxkeys;
        newykeys = oldykeys;
    } else {
        newxkeys = 0;
        newykeys = oldykeys;

        /* Check whether the two projection functions involved in this
        ** swap are isolated. At the end, we'll be able to tell how many
        ** isolated projection functions are there by checking only these
        ** two functions again. This is done to eliminate the isolated
        ** projection functions from the node count.
        */
        isolated = - ((table->vars[xindex]->ref == 1) +
                     (table->vars[yindex]->ref == 1));

        /* The nodes in the x layer that do not depend on
        ** y will stay there; the others are put in a chain.
        ** The chain is handled as a LIFO; g points to the beginning.
        */
        g = NULL;
        if ((oldxkeys >= xslots || (unsigned) xslots == table->initSlots) &&
            oldxkeys <= DD_MAX_SUBTABLE_DENSITY * xslots) {
            for (i = 0; i < xslots; i++) {
                previousP = &(xlist[i]);
                f = *previousP;
                while (f != sentinel) {
                    next = f->next;
                    f1 = cuddT(f); f0 = cuddE(f);
                    if (f1->index != (DdHalfWord) yindex &&
                        Cudd_Regular(f0)->index != (DdHalfWord) yindex) {
                        /* stays */
                        newxkeys++;
                        *previousP = f;
                        previousP = &(f->next);
                    } else {
                        f->index = yindex;
                        f->next = g;
                        g = f;
                    }
                    f = next;
                } /* while there are elements in the collision chain */
                *previousP = sentinel;
            } /* for each slot of the x subtable */
        } else {                /* resize xlist */
            DdNode *h = NULL;
            DdNodePtr *newxlist;
            unsigned int newxslots;
            int newxshift;
            /* Empty current xlist. Nodes that stay go to list h;
            ** nodes that move go to list g. */
            for (i = 0; i < xslots; i++) {
                f = xlist[i];
                while (f != sentinel) {
                    next = f->next;
                    f1 = cuddT(f); f0 = cuddE(f);
                    if (f1->index != (DdHalfWord) yindex &&
                        Cudd_Regular(f0)->index != (DdHalfWord) yindex) {
                        /* stays */
                        f->next = h;
                        h = f;
                        newxkeys++;
                    } else {
                        f->index = yindex;
                        f->next = g;
                        g = f;
                    }
                    f = next;
                } /* while there are elements in the collision chain */
            } /* for each slot of the x subtable */
            /* Decide size of new subtable. */
            newxshift = xshift;
            newxslots = xslots;
            while ((unsigned) oldxkeys > DD_MAX_SUBTABLE_DENSITY * newxslots) {
                newxshift--;
                newxslots <<= 1;
            }
            while ((unsigned) oldxkeys < newxslots &&
                   newxslots > table->initSlots) {
                newxshift++;
                newxslots >>= 1;
            }
            /* Try to allocate new table. Be ready to back off. */
            saveHandler = MMoutOfMemory;
            MMoutOfMemory = Cudd_OutOfMem;
            newxlist = ABC_ALLOC(DdNodePtr, newxslots);
            MMoutOfMemory = saveHandler;
            if (newxlist == NULL) {
                (void) fprintf(table->err, "Unable to resize subtable %d for lack of memory\n", i);
                newxlist = xlist;
                newxslots = xslots;
                newxshift = xshift;
            } else {
                table->slots += ((int) newxslots - xslots);
                table->minDead = (unsigned)
                    (table->gcFrac * (double) table->slots);
                table->cacheSlack = (int)
                    ddMin(table->maxCacheHard, DD_MAX_CACHE_TO_SLOTS_RATIO
                          * table->slots) - 2 * (int) table->cacheSlots;
                table->memused +=
                    ((int) newxslots - xslots) * sizeof(DdNodePtr);
                ABC_FREE(xlist);
                xslots =  newxslots;
                xshift = newxshift;
                xlist = newxlist;
            }
            /* Initialize new subtable. */
            for (i = 0; i < xslots; i++) {
                xlist[i] = sentinel;
            }
            /* Move nodes that were parked in list h to their new home. */
            f = h;
            while (f != NULL) {
                next = f->next;
                f1 = cuddT(f);
                f0 = cuddE(f);
                /* Check xlist for pair (f11,f01). */
                posn = ddHash(cuddF2L(f1), cuddF2L(f0), xshift);
                /* For each element tmp in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                tmp = *previousP;
                while (f1 < cuddT(tmp)) {
                    previousP = &(tmp->next);
                    tmp = *previousP;
                }
                while (f1 == cuddT(tmp) && f0 < cuddE(tmp)) {
                    previousP = &(tmp->next);
                    tmp = *previousP;
                }
                f->next = *previousP;
                *previousP = f;
                f = next;
            }
        }

#ifdef DD_COUNT
        table->swapSteps += oldxkeys - newxkeys;
#endif
        /* Take care of the x nodes that must be re-expressed.
        ** They form a linked list pointed by g. Their index has been
        ** already changed to yindex.
        */
        f = g;
        while (f != NULL) {
            next = f->next;
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f1)));
#endif
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                f11 = f10 = f1;
            }
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f11)));
#endif
            f0 = cuddE(f);
            comple = Cudd_IsComplement(f0);
            f0 = Cudd_Regular(f0);
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }
            /* Decrease ref count of f1. */
            cuddSatDec(f1->ref);
            /* Create the new T child. */
            if (f11 == f01) {
                newf1 = f11;
                cuddSatInc(newf1->ref);
            } else {
                /* Check xlist for triple (xindex,f11,f01). */
                posn = ddHash(cuddF2L(f11), cuddF2L(f01), xshift);
                /* For each element newf1 in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                newf1 = *previousP;
                while (f11 < cuddT(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                while (f11 == cuddT(newf1) && f01 < cuddE(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                if (cuddT(newf1) == f11 && cuddE(newf1) == f01) {
                    cuddSatInc(newf1->ref);
                } else { /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto cuddSwapOutOfMem;
                    newf1->index = xindex; newf1->ref = 1;
                    cuddT(newf1) = f11;
                    cuddE(newf1) = f01;
                    /* Insert newf1 in the collision list xlist[posn];
                    ** increase the ref counts of f11 and f01.
                    */
                    newxkeys++;
                    newf1->next = *previousP;
                    *previousP = newf1;
                    cuddSatInc(f11->ref);
                    tmp = Cudd_Regular(f01);
                    cuddSatInc(tmp->ref);
                }
            }
            cuddT(f) = newf1;
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(newf1)));
#endif

            /* Do the same for f0, keeping complement dots into account. */
            /* Decrease ref count of f0. */
            tmp = Cudd_Regular(f0);
            cuddSatDec(tmp->ref);
            /* Create the new E child. */
            if (f10 == f00) {
                newf0 = f00;
                tmp = Cudd_Regular(newf0);
                cuddSatInc(tmp->ref);
            } else {
                /* make sure f10 is regular */
                newcomplement = Cudd_IsComplement(f10);
                if (newcomplement) {
                    f10 = Cudd_Not(f10);
                    f00 = Cudd_Not(f00);
                }
                /* Check xlist for triple (xindex,f10,f00). */
                posn = ddHash(cuddF2L(f10), cuddF2L(f00), xshift);
                /* For each element newf0 in collision list xlist[posn]. */
                previousP = &(xlist[posn]);
                newf0 = *previousP;
                while (f10 < cuddT(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                while (f10 == cuddT(newf0) && f00 < cuddE(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                if (cuddT(newf0) == f10 && cuddE(newf0) == f00) {
                    cuddSatInc(newf0->ref);
                } else { /* no match */
                    newf0 = cuddDynamicAllocNode(table);
                    if (newf0 == NULL)
                        goto cuddSwapOutOfMem;
                    newf0->index = xindex; newf0->ref = 1;
                    cuddT(newf0) = f10;
                    cuddE(newf0) = f00;
                    /* Insert newf0 in the collision list xlist[posn];
                    ** increase the ref counts of f10 and f00.
                    */
                    newxkeys++;
                    newf0->next = *previousP;
                    *previousP = newf0;
                    cuddSatInc(f10->ref);
                    tmp = Cudd_Regular(f00);
                    cuddSatInc(tmp->ref);
                }
                if (newcomplement) {
                    newf0 = Cudd_Not(newf0);
                }
            }
            cuddE(f) = newf0;

            /* Insert the modified f in ylist.
            ** The modified f does not already exists in ylist.
            ** (Because of the uniqueness of the cofactors.)
            */
            posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), yshift);
            newykeys++;
            previousP = &(ylist[posn]);
            tmp = *previousP;
            while (newf1 < cuddT(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            while (newf1 == cuddT(tmp) && newf0 < cuddE(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            f->next = *previousP;
            *previousP = f;
            f = next;
        } /* while f != NULL */

        /* GC the y layer. */

        /* For each node f in ylist. */
        for (i = 0; i < yslots; i++) {
            previousP = &(ylist[i]);
            f = *previousP;
            while (f != sentinel) {
                next = f->next;
                if (f->ref == 0) {
                    tmp = cuddT(f);
                    cuddSatDec(tmp->ref);
                    tmp = Cudd_Regular(cuddE(f));
                    cuddSatDec(tmp->ref);
                    cuddDeallocNode(table,f);
                    newykeys--;
                } else {
                    *previousP = f;
                    previousP = &(f->next);
                }
                f = next;
            } /* while f */
            *previousP = sentinel;
        } /* for i */

#ifdef DD_DEBUG
#if 0
        (void) fprintf(table->out,"Swapping %d and %d\n",x,y);
#endif
        count = 0;
        idcheck = 0;
        for (i = 0; i < yslots; i++) {
            f = ylist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) yindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newykeys) {
            (void) fprintf(table->out,
                           "Error in finding newykeys\toldykeys = %d\tnewykeys = %d\tactual = %d\n",
                           oldykeys,newykeys,count);
        }
        if (idcheck != 0)
            (void) fprintf(table->out,
                           "Error in id's of ylist\twrong id's = %d\n",
                           idcheck);
        count = 0;
        idcheck = 0;
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) xindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newxkeys) {
            (void) fprintf(table->out,
                           "Error in finding newxkeys\toldxkeys = %d \tnewxkeys = %d \tactual = %d\n",
                           oldxkeys,newxkeys,count);
        }
        if (idcheck != 0)
            (void) fprintf(table->out,
                           "Error in id's of xlist\twrong id's = %d\n",
                           idcheck);
#endif

        isolated += (table->vars[xindex]->ref == 1) +
                    (table->vars[yindex]->ref == 1);
        table->isolated += isolated;
    }

    /* Set the appropriate fields in table. */
    table->subtables[x].nodelist = ylist;
    table->subtables[x].slots = yslots;
    table->subtables[x].shift = yshift;
    table->subtables[x].keys = newykeys;
    table->subtables[x].maxKeys = yslots * DD_MAX_SUBTABLE_DENSITY;
    i = table->subtables[x].bindVar;
    table->subtables[x].bindVar = table->subtables[y].bindVar;
    table->subtables[y].bindVar = i;
    /* Adjust filds for lazy sifting. */
    varType = table->subtables[x].varType;
    table->subtables[x].varType = table->subtables[y].varType;
    table->subtables[y].varType = varType;
    i = table->subtables[x].pairIndex;
    table->subtables[x].pairIndex = table->subtables[y].pairIndex;
    table->subtables[y].pairIndex = i;
    i = table->subtables[x].varHandled;
    table->subtables[x].varHandled = table->subtables[y].varHandled;
    table->subtables[y].varHandled = i;
    groupType = table->subtables[x].varToBeGrouped;
    table->subtables[x].varToBeGrouped = table->subtables[y].varToBeGrouped;
    table->subtables[y].varToBeGrouped = groupType;

    table->subtables[y].nodelist = xlist;
    table->subtables[y].slots = xslots;
    table->subtables[y].shift = xshift;
    table->subtables[y].keys = newxkeys;
    table->subtables[y].maxKeys = xslots * DD_MAX_SUBTABLE_DENSITY;

    table->perm[xindex] = y; table->perm[yindex] = x;
    table->invperm[x] = yindex; table->invperm[y] = xindex;

    table->keys += newxkeys + newykeys - oldxkeys - oldykeys;

    return(table->keys - table->isolated);

cuddSwapOutOfMem:
    (void) fprintf(table->err,"Error: cuddSwapInPlace out of memory\n");

    return (0);

}